

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

void hessian_fdg(custom_gradient *funcgrad,double *x,int N,double *jac,double *dx,double eps2,
                double *H)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  
  fdjac(funcgrad,x,N,jac,dx,eps2,H);
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
    uVar2 = 0;
    pdVar3 = H;
    do {
      uVar5 = 0;
      pdVar4 = H;
      do {
        pdVar3[uVar5] = (pdVar3[uVar5] + *pdVar4) * 0.5;
        uVar5 = uVar5 + 1;
        pdVar4 = pdVar4 + uVar1;
      } while (uVar1 != uVar5);
      uVar2 = uVar2 + 1;
      pdVar3 = pdVar3 + uVar1;
      H = H + 1;
    } while (uVar2 != uVar1);
  }
  return;
}

Assistant:

void hessian_fdg(custom_gradient *funcgrad, double *x, int N, double *jac, double *dx, double eps2, double *H) {
	int i,j,k;

	fdjac(funcgrad,x,N,jac,dx,eps2,H);

	for(i = 0; i < N;++i) {
		k = i * N;
		for(j = 0; j < N;++j) {
			H[k + j] = (H[k + j] + H[j*N + i]) / 2.0;
		}
	}
}